

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-info.cpp
# Opt level: O2

void __thiscall MyPictureDescriptor::MyDump(MyPictureDescriptor *this,FILE *stream)

{
  byte bVar1;
  uint uVar2;
  JPEG2000PictureSubDescriptor *pJVar3;
  byte_t *pbVar4;
  ILogSink *this_00;
  CDCIEssenceDescriptor *pCVar5;
  ui8_t *puVar6;
  ulong uVar7;
  ulong uVar8;
  int i;
  ImageComponent_t image_components [3];
  CodingStyleDefault_t coding_style_default;
  
  if (stream == (FILE *)0x0) {
    stream = (FILE *)_stderr;
  }
  pCVar5 = this->m_CDCIDescriptor;
  if ((pCVar5 != (CDCIEssenceDescriptor *)0x0) ||
     (pCVar5 = (CDCIEssenceDescriptor *)this->m_RGBADescriptor,
     pCVar5 != (CDCIEssenceDescriptor *)0x0)) {
    (**(code **)(*(long *)pCVar5 + 0x88))(pCVar5,stream);
    pJVar3 = this->m_JP2KSubDescriptor;
    if (pJVar3 != (JPEG2000PictureSubDescriptor *)0x0) {
      (**(code **)(*(long *)pJVar3 + 0x88))(pJVar3,stream);
      fprintf((FILE *)stream,"    ImageComponents: (max=%d)\n",3);
      uVar2 = *(uint *)(this->m_JP2KSubDescriptor + 0xdc);
      if (uVar2 == 0x11) {
        pbVar4 = Kumu::ByteString::RoData((ByteString *)(this->m_JP2KSubDescriptor + 200));
        image_components._0_8_ = *(undefined8 *)(pbVar4 + 8);
        image_components[2].YRsize = pbVar4[0x10];
      }
      else {
        this_00 = (ILogSink *)Kumu::DefaultLogSink();
        Kumu::ILogSink::Warn
                  (this_00,"Unexpected PictureComponentSizing size: %u, should be 17.\n",
                   (ulong)uVar2);
      }
      fwrite("  bits  h-sep v-sep\n",0x14,1,(FILE *)stream);
      puVar6 = &image_components[0].YRsize;
      for (uVar8 = 0; (uVar8 < 3 && (uVar8 < *(ushort *)(this->m_JP2KSubDescriptor + 0xc4)));
          uVar8 = uVar8 + 1) {
        fprintf((FILE *)stream,"  %4d  %5d %5d\n",
                (ulong)(((ImageComponent_t *)(puVar6 + -2))->Ssize + 1),(ulong)puVar6[-1],
                (ulong)*puVar6);
        puVar6 = puVar6 + 3;
      }
      pbVar4 = Kumu::ByteString::RoData((ByteString *)(this->m_JP2KSubDescriptor + 0xe8));
      memcpy(&coding_style_default,pbVar4,(ulong)*(uint *)(this->m_JP2KSubDescriptor + 0xfc));
      fprintf((FILE *)stream,"               Scod: %hhu\n",(ulong)coding_style_default.Scod);
      fprintf((FILE *)stream,"   ProgressionOrder: %hhu\n",
              (ulong)coding_style_default.SGcod.ProgressionOrder);
      fprintf((FILE *)stream,"     NumberOfLayers: %hd\n",
              (ulong)(ushort)((short)coding_style_default.SGcod.NumberOfLayers << 8 |
                             (ushort)coding_style_default.SGcod.NumberOfLayers >> 8));
      fprintf((FILE *)stream," MultiCompTransform: %hhu\n",
              (ulong)coding_style_default.SGcod.MultiCompTransform);
      fprintf((FILE *)stream,"DecompositionLevels: %hhu\n",
              (ulong)coding_style_default.SPcod.DecompositionLevels);
      fprintf((FILE *)stream,"     CodeblockWidth: %hhu\n",
              (ulong)coding_style_default.SPcod.CodeblockWidth);
      fprintf((FILE *)stream,"    CodeblockHeight: %hhu\n",
              (ulong)coding_style_default.SPcod.CodeblockHeight);
      fprintf((FILE *)stream,"     CodeblockStyle: %hhu\n",
              (ulong)coding_style_default.SPcod.CodeblockStyle);
      fprintf((FILE *)stream,"     Transformation: %hhu\n",
              (ulong)coding_style_default.SPcod.Transformation);
      for (uVar8 = 0; (uVar8 < 0x20 && (coding_style_default.SPcod.PrecinctSize[uVar8] != '\0'));
          uVar8 = uVar8 + 1) {
      }
      fprintf((FILE *)stream,"          Precincts: %u\n",uVar8 & 0xffffffff);
      fwrite("precinct dimensions:\n",0x15,1,(FILE *)stream);
      uVar7 = 0;
      while (uVar8 != uVar7) {
        bVar1 = coding_style_default.SPcod.PrecinctSize[uVar7];
        uVar7 = uVar7 + 1;
        fprintf((FILE *)stream,"    %d: %d x %d\n",uVar7 & 0xffffffff,
                (ulong)(uint)s_exp_lookup[bVar1 & 0xf],(ulong)(uint)s_exp_lookup[bVar1 >> 4]);
      }
    }
  }
  return;
}

Assistant:

void MyDump(FILE* stream) {
    if ( stream == 0 )
      {
	stream = stderr;
      }

    if ( m_CDCIDescriptor != 0 )
      {
	m_CDCIDescriptor->Dump(stream);
      }
    else if ( m_RGBADescriptor != 0 )
      {
	m_RGBADescriptor->Dump(stream);
      }
    else
      {
	return;
      }

    if ( m_JP2KSubDescriptor != 0 )
      {
	m_JP2KSubDescriptor->Dump(stream);

	fprintf(stream, "    ImageComponents: (max=%d)\n", JP2K::MaxComponents);

	//
	ui32_t component_sizing = m_JP2KSubDescriptor->PictureComponentSizing.const_get().Length();
	JP2K::ImageComponent_t image_components[JP2K::MaxComponents];

	if ( component_sizing == 17 ) // ( 2 * sizeof(ui32_t) ) + 3 components * 3 byte each
	  {
	    memcpy(&image_components,
		   m_JP2KSubDescriptor->PictureComponentSizing.const_get().RoData() + 8,
		   component_sizing - 8);
	  }
	else
	  {
	    DefaultLogSink().Warn("Unexpected PictureComponentSizing size: %u, should be 17.\n", component_sizing);
	  }

	fprintf(stream, "  bits  h-sep v-sep\n");

	for ( int i = 0; i < m_JP2KSubDescriptor->Csize && i < JP2K::MaxComponents; i++ )
	  {
	    fprintf(stream, "  %4d  %5d %5d\n",
		    image_components[i].Ssize + 1, // See ISO 15444-1, Table A11, for the origin of '+1'
		    image_components[i].XRsize,
		    image_components[i].YRsize
		    );
	  }

	//
	JP2K::CodingStyleDefault_t coding_style_default;

	memcpy(&coding_style_default,
	       m_JP2KSubDescriptor->CodingStyleDefault.const_get().RoData(),
	       m_JP2KSubDescriptor->CodingStyleDefault.const_get().Length());

	fprintf(stream, "               Scod: %hhu\n", coding_style_default.Scod);
	fprintf(stream, "   ProgressionOrder: %hhu\n", coding_style_default.SGcod.ProgressionOrder);
	fprintf(stream, "     NumberOfLayers: %hd\n",
		KM_i16_BE(Kumu::cp2i<ui16_t>(coding_style_default.SGcod.NumberOfLayers)));
    
	fprintf(stream, " MultiCompTransform: %hhu\n", coding_style_default.SGcod.MultiCompTransform);
	fprintf(stream, "DecompositionLevels: %hhu\n", coding_style_default.SPcod.DecompositionLevels);
	fprintf(stream, "     CodeblockWidth: %hhu\n", coding_style_default.SPcod.CodeblockWidth);
	fprintf(stream, "    CodeblockHeight: %hhu\n", coding_style_default.SPcod.CodeblockHeight);
	fprintf(stream, "     CodeblockStyle: %hhu\n", coding_style_default.SPcod.CodeblockStyle);
	fprintf(stream, "     Transformation: %hhu\n", coding_style_default.SPcod.Transformation);
    
	ui32_t precinct_set_size = 0;

	for ( int i = 0; coding_style_default.SPcod.PrecinctSize[i] != 0 && i < JP2K::MaxPrecincts; ++i )
	  {
	    ++precinct_set_size;
	  }

	fprintf(stream, "          Precincts: %u\n", precinct_set_size);
	fprintf(stream, "precinct dimensions:\n");

	for ( unsigned int i = 0; i < precinct_set_size && i < JP2K::MaxPrecincts; i++ )
	  fprintf(stream, "    %d: %d x %d\n", i + 1,
		  s_exp_lookup[coding_style_default.SPcod.PrecinctSize[i]&0x0f],
		  s_exp_lookup[(coding_style_default.SPcod.PrecinctSize[i]>>4)&0x0f]
		  );
      }
  }